

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_boxtype.cxx
# Opt level: O2

void fl_rectbound(int x,int y,int w,int h,Fl_Color bgcolor)

{
  Fl::set_box_color(0x38);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
            (fl_graphics_driver,(ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)h);
  Fl::set_box_color(bgcolor);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)(x + 1),(ulong)(y + 1),(ulong)(w - 2),(ulong)(h - 2));
  return;
}

Assistant:

void fl_rectbound(int x, int y, int w, int h, Fl_Color bgcolor) {
  Fl::set_box_color(FL_BLACK);
  fl_rect(x, y, w, h);
  Fl::set_box_color(bgcolor);
  fl_rectf(x+1, y+1, w-2, h-2);
}